

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expression.cpp
# Opt level: O0

tuple<const_slang::ast::Expression_*,_const_slang::ast::Type_*>
slang::ast::Expression::bindImplicitParam
          (DataTypeSyntax *typeSyntax,ExpressionSyntax *rhs,SourceRange assignmentRange,
          ASTContext *exprContext,ASTContext *typeContext,bitmask<slang::ast::ASTFlags> extraFlags)

{
  SourceRange assignmentRange_00;
  bool bVar1;
  uint *puVar2;
  bitmask<slang::ast::ASTFlags> in_RCX;
  ASTContext *in_RDX;
  Expression *extraout_RDX;
  Expression *extraout_RDX_00;
  _Head_base<0UL,_const_slang::ast::Expression_*,_false> _Var3;
  SyntaxNode *in_RSI;
  SourceLocation in_RDI;
  undefined8 in_R8;
  tuple<const_slang::ast::Expression_*,_const_slang::ast::Type_*> tVar4;
  bitmask<slang::ast::IntegralFlags> unaff_retaddr;
  Type *in_stack_00000010;
  bitmask<slang::ast::IntegralFlags> flags_1;
  bitwidth_t bits_1;
  bitmask<slang::ast::IntegralFlags> flags;
  bitwidth_t bits;
  Type *lhsType;
  Expression *expr;
  Type *lhsType_1;
  ImplicitTypeSyntax *it;
  Compilation *comp;
  SourceRange in_stack_000000d0;
  Type *in_stack_000000e8;
  ASTContext *in_stack_000000f0;
  ExpressionSyntax *in_stack_000000f8;
  Compilation *in_stack_00000100;
  bitmask<slang::ast::ASTFlags> in_stack_00000108;
  Type *in_stack_ffffffffffffff28;
  Expression **__a1;
  Type *in_stack_ffffffffffffff30;
  _Head_base<1UL,_const_slang::ast::Type_*,_false> this;
  bitmask<slang::ast::IntegralFlags> local_9a;
  bitmask<slang::ast::IntegralFlags> local_99;
  uint local_98;
  bitwidth_t local_94;
  underlying_type local_8f;
  bitmask<slang::ast::IntegralFlags> local_8e;
  bitmask<slang::ast::IntegralFlags> local_8d;
  bitwidth_t local_8c;
  Type *local_88;
  Expression *local_78;
  undefined8 local_60;
  Expression *local_58;
  Type *local_50;
  ImplicitTypeSyntax *local_48;
  Compilation *local_40;
  undefined4 uVar5;
  bitwidth_t width;
  SourceLocation this_00;
  
  uVar5 = (undefined4)in_R8;
  width = (bitwidth_t)((ulong)in_R8 >> 0x20);
  this._M_head_impl = (Type *)in_RDI;
  this_00 = in_RDI;
  local_40 = ASTContext::getCompilation((ASTContext *)0x8a45e9);
  local_48 = slang::syntax::SyntaxNode::as<slang::syntax::ImplicitTypeSyntax>(in_RSI);
  bVar1 = std::span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>::empty
                    ((span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL> *)
                     0x8a461b);
  if (bVar1) {
    local_78 = create(in_stack_00000100,in_stack_000000f8,in_stack_000000f0,in_stack_00000108,
                      in_stack_000000e8);
    local_88 = not_null::operator_cast_to_Type_((not_null<const_slang::ast::Type_*> *)0x8a470d);
    bVar1 = parsing::Token::operator_cast_to_bool((Token *)0x8a4723);
    if (bVar1) {
      local_8c = Type::getBitWidth((Type *)in_RDI);
      bVar1 = Type::isIntegral(in_stack_ffffffffffffff30);
      if ((!bVar1) || (bVar1 = isUnsizedInteger((Expression *)in_RDI), bVar1)) {
        local_8c = 0x20;
      }
      bitmask<slang::ast::IntegralFlags>::bitmask(&local_8d,FourState);
      if ((local_48->signing).kind == SignedKeyword) {
        bitmask<slang::ast::IntegralFlags>::bitmask(&local_8e,Signed);
        bitmask<slang::ast::IntegralFlags>::operator|=(&local_8d,&local_8e);
      }
      local_8f = local_8d.m_bits;
      local_88 = Compilation::getType((Compilation *)this_00,width,unaff_retaddr);
    }
    else {
      bVar1 = Type::isIntegral(in_stack_ffffffffffffff30);
      if (bVar1) {
        local_94 = Type::getBitWidth((Type *)in_RDI);
        bVar1 = isUnsizedInteger((Expression *)in_RDI);
        if (bVar1) {
          local_98 = 0x20;
          puVar2 = std::max<unsigned_int>(&local_94,&local_98);
          local_94 = *puVar2;
        }
        local_99 = Type::getIntegralFlags((Type *)in_RDI);
        bitmask<slang::ast::IntegralFlags>::bitmask(&local_9a,FourState);
        bitmask<slang::ast::IntegralFlags>::operator|=(&local_99,&local_9a);
        local_88 = Compilation::getType((Compilation *)this_00,width,unaff_retaddr);
      }
    }
    __a1 = (Expression **)0x0;
    convertAssignment((ASTContext *)assignmentRange.endLoc,(Type *)assignmentRange.startLoc,
                      (Expression *)extraFlags.m_bits,in_stack_000000d0,(Expression **)typeSyntax,
                      (bitmask<slang::ast::AssignFlags> *)in_stack_000000f0);
    std::tuple<const_slang::ast::Expression_*,_const_slang::ast::Type_*>::
    tuple<slang::ast::Expression_*,_const_slang::ast::Type_*&,_true>
              ((tuple<const_slang::ast::Expression_*,_const_slang::ast::Type_*> *)
               in_stack_ffffffffffffff30,__a1,(Type **)0x8a48c7);
    _Var3._M_head_impl = extraout_RDX_00;
  }
  else {
    local_50 = Compilation::getType
                         (this._M_head_impl,(DataTypeSyntax *)in_RDI,
                          (ASTContext *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    local_60 = CONCAT44(width,uVar5);
    assignmentRange_00.startLoc._4_4_ = width;
    assignmentRange_00.startLoc._0_4_ = uVar5;
    assignmentRange_00.endLoc = this_00;
    local_58 = bindRValue(in_stack_00000010,(ExpressionSyntax *)in_RSI,assignmentRange_00,in_RDX,
                          in_RCX);
    std::tuple<const_slang::ast::Expression_*,_const_slang::ast::Type_*>::
    tuple<const_slang::ast::Expression_*,_const_slang::ast::Type_*&,_true>
              ((tuple<const_slang::ast::Expression_*,_const_slang::ast::Type_*> *)
               in_stack_ffffffffffffff30,(Expression **)in_stack_ffffffffffffff28,(Type **)0x8a46c1)
    ;
    _Var3._M_head_impl = extraout_RDX;
  }
  tVar4.super__Tuple_impl<0UL,_const_slang::ast::Expression_*,_const_slang::ast::Type_*>.
  super__Head_base<0UL,_const_slang::ast::Expression_*,_false>._M_head_impl = _Var3._M_head_impl;
  tVar4.super__Tuple_impl<0UL,_const_slang::ast::Expression_*,_const_slang::ast::Type_*>.
  super__Tuple_impl<1UL,_const_slang::ast::Type_*>.
  super__Head_base<1UL,_const_slang::ast::Type_*,_false>._M_head_impl =
       (_Head_base<1UL,_const_slang::ast::Type_*,_false>)
       (_Head_base<1UL,_const_slang::ast::Type_*,_false>)this._M_head_impl;
  return (tuple<const_slang::ast::Expression_*,_const_slang::ast::Type_*>)
         tVar4.super__Tuple_impl<0UL,_const_slang::ast::Expression_*,_const_slang::ast::Type_*>;
}

Assistant:

std::tuple<const Expression*, const Type*> Expression::bindImplicitParam(
    const DataTypeSyntax& typeSyntax, const ExpressionSyntax& rhs, SourceRange assignmentRange,
    const ASTContext& exprContext, const ASTContext& typeContext, bitmask<ASTFlags> extraFlags) {

    // Rules are described in [6.20.2].
    Compilation& comp = exprContext.getCompilation();
    auto& it = typeSyntax.as<ImplicitTypeSyntax>();
    if (!it.dimensions.empty()) {
        // If we have a range provided, the result is always an integral value
        // of the provided width -- getType() will do what we want here.
        auto lhsType = &comp.getType(typeSyntax, typeContext);
        return {&bindRValue(*lhsType, rhs, assignmentRange, exprContext, extraFlags), lhsType};
    }

    Expression& expr = create(comp, rhs, exprContext, extraFlags);
    const Type* lhsType = expr.type;
    if (it.signing) {
        // If signing is provided, the result is always integral but we infer the width.
        // If the type is non-integral or unsized, infer a width of 32.
        bitwidth_t bits = lhsType->getBitWidth();
        if (!lhsType->isIntegral() || expr.isUnsizedInteger())
            bits = 32;

        bitmask<IntegralFlags> flags = IntegralFlags::FourState;
        if (it.signing.kind == TokenKind::SignedKeyword)
            flags |= IntegralFlags::Signed;

        lhsType = &comp.getType(bits, flags);
    }
    else {
        // Neither range nor signing provided, so infer from the expression type.
        // If integral, infer using rules mentioned above. Otherwise just take the type.
        if (lhsType->isIntegral()) {
            bitwidth_t bits = lhsType->getBitWidth();
            if (expr.isUnsizedInteger())
                bits = std::max(bits, 32u);

            // Keep the signed flag but force four state.
            auto flags = lhsType->getIntegralFlags();
            flags |= IntegralFlags::FourState;

            lhsType = &comp.getType(bits, flags);
        }
    }

    return {&convertAssignment(exprContext, *lhsType, expr, assignmentRange), lhsType};
}